

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O1

int lisp_string_to_c_string(LispPTR Lisp,char *C,size_t length)

{
  ushort uVar1;
  uint uVar2;
  DLword *pDVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = -1;
  if ((*(ushort *)((ulong)(Lisp >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 0xe) {
    if ((Lisp & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)Lisp);
    }
    pDVar3 = Lisp_world;
    uVar4 = (ulong)*(uint *)(Lisp_world + (ulong)Lisp + 4);
    if ((uVar4 < 0x14) && ((char)Lisp_world[(ulong)Lisp + 3] == 'C')) {
      if (uVar4 != 0) {
        uVar2 = *(uint *)(Lisp_world + Lisp);
        uVar1 = Lisp_world[(ulong)Lisp + 2];
        uVar6 = 0;
        do {
          C[uVar6] = *(char *)((long)pDVar3 + uVar6 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2
                              ^ 3);
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      C[*(int *)(pDVar3 + (ulong)Lisp + 4)] = '\0';
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int lisp_string_to_c_string(LispPTR Lisp, char *C, size_t length) {
  OneDArray *arrayp;
  char *base;

  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->fillpointer >= length) { return (-1); } /* too long */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strncpy(C, base, arrayp->fillpointer);
#else
      {
        size_t l = arrayp->fillpointer;
        char *dp = C;
        for (size_t i = 0; i < l; i++) {
          *dp++ = (char)(GETBYTE(base++));
        }
      }
#endif /* BYTESWAP */

      C[arrayp->fillpointer] = '\0';
      return 0;
    default: return -1;
  }
}